

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O1

void __thiscall
Arithmetic_MultipleLocals_Test::~Arithmetic_MultipleLocals_Test
          (Arithmetic_MultipleLocals_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arithmetic, MultipleLocals) {
	// let a = 0 let b = 0 while true { a = a + 1 b = b + 2 }
	MOCK(
		BC3(BC_ADD_LN, 0, 0, 0),
		BC3(BC_ADD_LN, 1, 1, 1),
	);

	INS(IR_LOAD_STACK, 0, 0);
	INS(IR_LOAD_CONST, 0, 0);
	INS(IR_ADD, 1, 2);
	INS(IR_LOAD_STACK, 1, 0);
	INS(IR_LOAD_CONST, 1, 0);
	INS(IR_ADD, 4, 5);
}